

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_psbt.cpp
# Opt level: O1

void __thiscall
Psbt_SetInputRecordTest_Test::~Psbt_SetInputRecordTest_Test(Psbt_SetInputRecordTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Psbt, SetInputRecordTest) {
  Psbt psbt("cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAAAAA==");

  HDWallet wallet1 = HDWallet(ByteData(g_psbt_seed1));
  HDWallet wallet2 = HDWallet(ByteData(g_psbt_seed2));
  std::string path1 = "44h/0h/0h/1/1";
  std::string path2 = "44h/0h/0h/0/1";

  auto key1 = wallet1.GeneratePubkeyData(NetType::kTestnet, path1);
  auto key2 = wallet2.GeneratePubkeyData(NetType::kTestnet, path2);

  std::vector<uint8_t> txin_key_bytes(34);
  std::vector<uint8_t> txin_val_bytes;
  txin_key_bytes[0] = 6;
  auto pk_bytes1 = key1.GetPubkey().GetData().GetBytes();
  auto pk_bytes2 = key2.GetPubkey().GetData().GetBytes();
  auto fp1 = key1.GetFingerprint().GetBytes();
  auto fp2 = key2.GetFingerprint().GetBytes();
  auto plist1 = key1.GetChildNumArray();
  auto plist2 = key2.GetChildNumArray();
  memcpy(&txin_key_bytes[1], pk_bytes1.data(), 33);
  txin_val_bytes.resize(4 + (plist1.size() * 4));
  memcpy(txin_val_bytes.data(), fp1.data(), 4);
  memcpy(&txin_val_bytes.data()[4], plist1.data(), 4 * plist1.size());
  ByteData txout_key1 = ByteData(txin_key_bytes);
  ByteData txout_value1 = ByteData(txin_val_bytes);

  memcpy(&txin_key_bytes[1], pk_bytes2.data(), 33);
  txin_val_bytes.resize(4 + (plist2.size() * 4));
  memcpy(txin_val_bytes.data(), fp2.data(), 4);
  memcpy(&txin_val_bytes.data()[4], plist2.data(), 4 * plist2.size());
  ByteData txout_key2 = ByteData(txin_key_bytes);
  ByteData txout_value2 = ByteData(txin_val_bytes);

  psbt.SetTxInRecord(0, ByteData("00"), Transaction(g_psbt_utxo_witness).GetData());
  try {
    psbt.SetTxInRecord(0, ByteData("01"), ByteData("00e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac97530787"));
    psbt.SetTxInRecord(0, ByteData("03"), ByteData("01000000"));
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }
  psbt.SetTxInRecord(0, ByteData("04"), ByteData("0014962c4e08f336d3afbc3415c9d359ae1040470520"));
  psbt.SetTxInRecord(0, txout_key1, txout_value1);

  try {
    psbt.SetTxInRecord(1, ByteData("00"), Transaction(g_psbt_utxo_legacy).GetData());
    psbt.SetTxInRecord(1, txout_key2, txout_value2);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }

  EXPECT_STREQ("70736274ff01005c0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0000000000000100f602000000000101f1993fe8e7189542ee4506258e170201be292703cd275acb09ece16672fd848b0000000017160014ac9ef80b27af1c9d95c1db5d761319322bc42fc5ffffffff02080410240100000016001409de2a0431cbb3444fc22cad9d9a0fd09639721000e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac975307870247304402201e07df721c3322419e8f36d07eeae4795975ba0d9d19630ca3cd3dc0d4967172022015428e7be06b6567501539050bd791a380f00bbddbc5097ea97ba7be4017114a0121024aef43b1d5ac7ba5014998d63ceac583959d1fdc66ea2699cd84eeaf82a283060000000001012000e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac97530787010304010000000104160014962c4e08f336d3afbc3415c9d359ae1040470520220602565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe182a7047602c00008000000080000000800100000001000000000100bf0200000001c6d2ea36e2e802b52ddac665dacbed2f831b5263459e1ca734f5c945d7515e40000000006a473044022011b96c7d2d0d2e8dcb37138e18acc460752965add9cb8787df5c349df0e2ae6602202e93af31b64f5166e5605819555dabec57be794300fadb37052f31dddea9905c012103e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aecffffffff017851cd1d000000001976a9148d20443a91969e3bca0e240cd0ffe4dc98c63de288ac00000000220602d9f6888f285a15a6a1880a2202c2b230a42d77cf62da6a48aca4198262cda3c7189d6b6d862c0000800000008000000080000000000100000000", psbt.GetData().GetHex().c_str());
  EXPECT_STREQ("cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAABAPYCAAAAAAEB8Zk/6OcYlULuRQYljhcCAb4pJwPNJ1rLCezhZnL9hIsAAAAAFxYAFKye+AsnrxydlcHbXXYTGTIrxC/F/////wIIBBAkAQAAABYAFAneKgQxy7NET8IsrZ2aD9CWOXIQAOH1BQAAAAAXqRRQn1mF9OkKFPuQ45MW/bTzrJdTB4cCRzBEAiAeB99yHDMiQZ6PNtB+6uR5WXW6DZ0ZYwyjzT3A1JZxcgIgFUKOe+BrZWdQFTkFC9eRo4DwC73bxQl+qXunvkAXEUoBIQJK70Ox1ax7pQFJmNY86sWDlZ0f3GbqJpnNhO6vgqKDBgAAAAABASAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwEDBAEAAAABBBYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEAvwIAAAABxtLqNuLoArUt2sZl2svtL4MbUmNFnhynNPXJRddRXkAAAAAAakcwRAIgEblsfS0NLo3LNxOOGKzEYHUpZa3Zy4eH31w0nfDirmYCIC6TrzG2T1Fm5WBYGVVdq+xXvnlDAPrbNwUvMd3eqZBcASED49JEo5Z+C4d2X9qGxf84iF90mTlTuVhDiK7zCyavauz/////AXhRzR0AAAAAGXapFI0gRDqRlp47yg4kDND/5NyYxj3iiKwAAAAAIgYC2faIjyhaFaahiAoiAsKyMKQtd89i2mpIrKQZgmLNo8cYnWtthiwAAIAAAACAAAAAgAAAAAABAAAAAA==", psbt.GetBase64().c_str());

  Psbt psbt2(psbt.GetData());
  auto get_val1 = psbt2.GetTxInKeyData(0);
  auto get_val2 = psbt2.GetTxInKeyData(1);
  EXPECT_EQ(get_val1.ToString(), key1.ToString());
  EXPECT_EQ(get_val2.ToString(), key2.ToString());

  auto get_tx1 = psbt2.GetTxInUtxoFull(0);
  auto get_tx2 = psbt2.GetTxInUtxoFull(1);
  EXPECT_EQ(get_tx1.GetHex(), g_psbt_utxo_witness);
  EXPECT_EQ(get_tx2.GetHex(), g_psbt_utxo_legacy);

  ByteData global_key1 = Psbt::CreateRecordKey(kProprietary, "cfd", 0, "dummy1");
  ByteData global_value1 = ByteData("01020304");
  ByteData global_key2 = Psbt::CreateRecordKey(kProprietary, "cfd", 0, "dummy2");
  ByteData global_value2 = ByteData("00");
  psbt.SetTxInRecord(0, global_key1, global_value1);
  EXPECT_TRUE(psbt.IsFindTxInRecord(0, global_key1));
  EXPECT_FALSE(psbt.IsFindTxInRecord(0, global_key2));
  psbt.SetTxInRecord(0, global_key2, global_value2);
  EXPECT_TRUE(psbt.IsFindTxInRecord(0, global_key2));

  psbt2 = Psbt(psbt.GetData());
  auto get_gval1 = psbt2.GetTxInRecord(0, global_key1);
  auto get_gval2 = psbt2.GetTxInRecord(0, global_key2);
  EXPECT_EQ(get_gval1.GetHex(), global_value1.GetHex());
  EXPECT_EQ(get_gval2.GetHex(), global_value2.GetHex());

  auto key_list = psbt2.GetTxInRecordKeyList(0);
  EXPECT_EQ(2, key_list.size());
  if (key_list.size() == 2) {
    EXPECT_EQ(global_key1.GetHex(), key_list[0].GetHex());
    EXPECT_EQ(global_key2.GetHex(), key_list[1].GetHex());
  }
  EXPECT_STREQ("cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAABAPYCAAAAAAEB8Zk/6OcYlULuRQYljhcCAb4pJwPNJ1rLCezhZnL9hIsAAAAAFxYAFKye+AsnrxydlcHbXXYTGTIrxC/F/////wIIBBAkAQAAABYAFAneKgQxy7NET8IsrZ2aD9CWOXIQAOH1BQAAAAAXqRRQn1mF9OkKFPuQ45MW/bTzrJdTB4cCRzBEAiAeB99yHDMiQZ6PNtB+6uR5WXW6DZ0ZYwyjzT3A1JZxcgIgFUKOe+BrZWdQFTkFC9eRo4DwC73bxQl+qXunvkAXEUoBIQJK70Ox1ax7pQFJmNY86sWDlZ0f3GbqJpnNhO6vgqKDBgAAAAABASAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwEDBAEAAAABBBYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAADfwDY2ZkAAZkdW1teTEEAQIDBA38A2NmZAAGZHVtbXkyAQAAAQC/AgAAAAHG0uo24ugCtS3axmXay+0vgxtSY0WeHKc09clF11FeQAAAAABqRzBEAiARuWx9LQ0ujcs3E44YrMRgdSllrdnLh4ffXDSd8OKuZgIgLpOvMbZPUWblYFgZVV2r7Fe+eUMA+ts3BS8x3d6pkFwBIQPj0kSjln4Lh3Zf2obF/ziIX3SZOVO5WEOIrvMLJq9q7P////8BeFHNHQAAAAAZdqkUjSBEOpGWnjvKDiQM0P/k3JjGPeKIrAAAAAAiBgLZ9oiPKFoVpqGICiICwrIwpC13z2LaakispBmCYs2jxxida22GLAAAgAAAAIAAAACAAAAAAAEAAAAA", psbt2.GetBase64().c_str());
}